

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O0

uint CalculateCRC(uint bufferCRC,size_t data)

{
  BOOL BVar1;
  undefined8 uVar2;
  size_t data_local;
  uint bufferCRC_local;
  
  BVar1 = AutoSystemInfo::SSE4_2Available(&AutoSystemInfo::Data);
  if (BVar1 == 0) {
    data_local._4_4_ = CalculateCRC32(bufferCRC,data);
  }
  else {
    uVar2 = crc32((ulong)bufferCRC,data);
    data_local._4_4_ = (uint)uVar2;
  }
  return data_local._4_4_;
}

Assistant:

uint CalculateCRC(uint bufferCRC, size_t data)
{
#if defined(_WIN32) || defined(__SSE4_2__)
#if defined(_M_IX86)
    if (AutoSystemInfo::Data.SSE4_2Available())
    {
        return _mm_crc32_u32(bufferCRC, data);
    }
#elif defined(_M_X64)
    if (AutoSystemInfo::Data.SSE4_2Available())
    {
        //CRC32 always returns a 32-bit result
        return (uint)_mm_crc32_u64(bufferCRC, data);
    }
#endif
#endif
    return CalculateCRC32(bufferCRC, data);
}